

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cpp
# Opt level: O0

tokens __thiscall Ident::Tk(Ident *this,bool isStrictMode)

{
  uint32 luHash_00;
  uint32 cch_00;
  LPCOLESTR prgch_00;
  uint32 cch;
  LPCOLESTR prgch;
  uint32 luHash;
  tokens token;
  bool isStrictMode_local;
  Ident *this_local;
  
  this_local._4_4_ = (tokens)this->m_tk;
  if (this_local._4_4_ == tkLim) {
    this->m_tk = 0;
    luHash_00 = this->m_luHash;
    prgch_00 = Psz(this);
    cch_00 = Cch(this);
    this_local._4_4_ =
         TkFromNameLen(luHash_00,prgch_00,cch_00,isStrictMode,&this->m_grfid,&this->m_tk);
  }
  else if (((this_local._4_4_ == tkNone) || ((this->m_grfid & 1) == 0)) &&
          ((!isStrictMode || ((this->m_grfid & 2) == 0)))) {
    this_local._4_4_ = tkID;
  }
  return this_local._4_4_;
}

Assistant:

tokens Ident::Tk(bool isStrictMode)
{
    const tokens token = (tokens)m_tk;
    if (token == tkLim)
    {
        m_tk = tkNone;
        const uint32 luHash = this->m_luHash;
        const LPCOLESTR prgch = Psz();
        const uint32 cch = Cch();

        return TkFromNameLen(luHash, prgch, cch, isStrictMode, &this->m_grfid, &this->m_tk);
    }
    else if (token == tkNone || !(m_grfid & fidKwdRsvd))
    {
        if ( !isStrictMode || !(m_grfid & fidKwdFutRsvd))
        {
            return tkID;
        }
    }
    return token;
}